

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

void __thiscall Parsing::File::parseExt(File *this,string *s)

{
  char cVar1;
  pointer pcVar2;
  long lVar3;
  char *pcVar4;
  pointer pcVar5;
  long *local_38 [2];
  long local_28 [2];
  
  lVar3 = std::__cxx11::string::find((char *)s,0x108150,0);
  if (lVar3 == -1) {
    (this->_ext)._M_string_length = 0;
    *(this->_ext)._M_dataplus._M_p = '\0';
  }
  pcVar2 = (s->_M_dataplus)._M_p;
  pcVar5 = pcVar2 + (s->_M_string_length - 1);
  if (pcVar2 < pcVar5 && s->_M_string_length != 0) {
    do {
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  std::__cxx11::string::find_first_of((char *)s,0x108150,0);
  std::__cxx11::string::substr((ulong)local_38,(ulong)s);
  std::__cxx11::string::operator=((string *)s,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  pcVar2 = (s->_M_dataplus)._M_p;
  pcVar5 = pcVar2 + (s->_M_string_length - 1);
  if (pcVar2 < pcVar5 && s->_M_string_length != 0) {
    do {
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

void File::parseExt(std::string s)
    {
        if (s.find(".") == std::string::npos)
            _ext.clear();

        std::reverse(s.begin(), s.end());

        s = s.substr(0, s.find_first_of("."));
        std::reverse(s.begin(), s.end());
        _ext = s;
    }